

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void randomBlob(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  ulong uVar2;
  void *pBuf;
  
  uVar2 = sqlite3VdbeIntValue(*argv);
  uVar1 = 1;
  if (1 < (int)uVar2) {
    uVar1 = uVar2;
  }
  pBuf = contextMalloc(context,uVar1 & 0xffffffff);
  if (pBuf != (void *)0x0) {
    sqlite3_randomness((int)uVar1,pBuf);
    sqlite3_result_blob(context,pBuf,(int)uVar1,sqlite3_free);
    return;
  }
  return;
}

Assistant:

static void randomBlob(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int n;
  unsigned char *p;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  n = sqlite3_value_int(argv[0]);
  if( n<1 ){
    n = 1;
  }
  p = contextMalloc(context, n);
  if( p ){
    sqlite3_randomness(n, p);
    sqlite3_result_blob(context, (char*)p, n, sqlite3_free);
  }
}